

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_encoded_list_size(AMQP_VALUE *items,uint32_t count,uint32_t *encoded_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t item_size;
  LOGGER_LOG l;
  size_t i;
  uint32_t *puStack_20;
  int result;
  uint32_t *encoded_size_local;
  AMQP_VALUE *ppAStack_10;
  uint32_t count_local;
  AMQP_VALUE *items_local;
  
  puStack_20 = encoded_size;
  encoded_size_local._4_4_ = count;
  ppAStack_10 = items;
  if (encoded_size == (uint32_t *)0x0) {
    item_size = (size_t)xlogging_get_log_function();
    if ((LOGGER_LOG)item_size != (LOGGER_LOG)0x0) {
      (*(code *)item_size)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                 ,"amqpvalue_get_encoded_list_size",0xea3,1,"Bad arguments: encoded_size = %p",
                 puStack_20);
    }
    i._4_4_ = 0xea4;
  }
  else {
    *encoded_size = 0;
    for (l = (LOGGER_LOG)0x0; l < (LOGGER_LOG)(ulong)encoded_size_local._4_4_; l = l + 1) {
      iVar1 = amqpvalue_get_encoded_size(ppAStack_10[(long)l],(size_t *)&l_1);
      uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_list_size",0xeb0,1,
                    "Could not get encoded size for element %u of the list",CONCAT44(uVar3,(int)l));
        }
        break;
      }
      if (((LOGGER_LOG)0xffffffff < l_1) || (*puStack_20 + (int)l_1 < *puStack_20)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_list_size",0xeb7,1,"Overflow in list size computation");
        }
        break;
      }
      *puStack_20 = *puStack_20 + (int)l_1;
    }
    if (l < (LOGGER_LOG)(ulong)encoded_size_local._4_4_) {
      i._4_4_ = 0xec0;
    }
    else {
      i._4_4_ = 0;
    }
  }
  return i._4_4_;
}

Assistant:

static int amqpvalue_get_encoded_list_size(AMQP_VALUE* items, uint32_t count, uint32_t* encoded_size)
{
    int result;
    size_t i;

    if (encoded_size == NULL)
    {
        LogError("Bad arguments: encoded_size = %p", encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;

        /* Get the size of all items in the list */
        for (i = 0; i < count; i++)
        {
            size_t item_size;
            if (amqpvalue_get_encoded_size(items[i], &item_size) != 0)
            {
                LogError("Could not get encoded size for element %u of the list", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Overflow in list size computation");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);
        }

        if (i < count)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}